

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.cpp
# Opt level: O3

void duckdb_brotli::BrotliBuildMetaBlock
               (MemoryManager *m,uint8_t *ringbuffer,size_t pos,size_t mask,
               BrotliEncoderParams *params,uint8_t prev_byte,uint8_t prev_byte2,Command *cmds,
               size_t num_commands,ContextType literal_context_mode,MetaBlockSplit *mb)

{
  BrotliDistanceParams *pBVar1;
  BlockSplit *dist_split;
  uint32_t *puVar2;
  uint32_t uVar3;
  undefined1 auVar4 [16];
  MemoryManager *m_00;
  undefined8 uVar5;
  int iVar6;
  HistogramDistance *pHVar7;
  ContextType *context_modes;
  HistogramCommand *insert_and_copy_histograms;
  size_t sVar8;
  uint32_t *puVar9;
  HistogramLiteral *pHVar10;
  byte bVar11;
  byte bVar12;
  ulong uVar13;
  uint32_t *puVar14;
  ulong uVar15;
  uint16_t *puVar16;
  uint uVar17;
  ulong uVar18;
  uint32_t ndirect;
  size_t sVar19;
  size_t sVar20;
  uint32_t uVar21;
  uint uVar22;
  long lVar23;
  bool bVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int iVar31;
  HistogramDistance *local_e0;
  HistogramLiteral *local_d8;
  double local_c0;
  double dist_cost;
  MemoryManager *local_70;
  BrotliDistanceParams orig_params;
  BrotliDistanceParams new_params;
  long lVar28;
  
  pBVar1 = &params->dist;
  orig_params.max_distance = (params->dist).max_distance;
  orig_params.distance_postfix_bits = (params->dist).distance_postfix_bits;
  orig_params.num_direct_distance_codes = (params->dist).num_direct_distance_codes;
  orig_params.alphabet_size_max = (params->dist).alphabet_size_max;
  orig_params.alphabet_size_limit = (params->dist).alphabet_size_limit;
  new_params.max_distance = (params->dist).max_distance;
  new_params.distance_postfix_bits = (params->dist).distance_postfix_bits;
  new_params.num_direct_distance_codes = (params->dist).num_direct_distance_codes;
  new_params.alphabet_size_max = (params->dist).alphabet_size_max;
  new_params.alphabet_size_limit = (params->dist).alphabet_size_limit;
  local_70 = m;
  pHVar7 = (HistogramDistance *)BrotliAllocate(m,0x890);
  uVar5 = orig_params._0_8_;
  uVar3 = orig_params.distance_postfix_bits;
  uVar22 = 0;
  bVar25 = true;
  local_c0 = 1e+99;
  uVar21 = 0;
  do {
    local_e0._0_4_ = SUB84(uVar5,4);
    if (uVar22 < 0x10) {
      do {
        ndirect = uVar22 << ((byte)uVar21 & 0x1f);
        BrotliInitDistanceParams(&new_params,uVar21,ndirect,params->large_window);
        if (ndirect == (uint32_t)local_e0 && uVar21 == uVar3) {
          bVar25 = false;
        }
        iVar6 = ComputeDistanceCost(cmds,num_commands,&orig_params,&new_params,&dist_cost,pHVar7);
        if ((iVar6 == 0) || (local_c0 < dist_cost)) {
          bVar24 = uVar22 == 0;
          uVar22 = uVar22 - 1 >> 1;
          if (bVar24) {
            uVar22 = 0;
          }
          goto LAB_003249c1;
        }
        (params->dist).max_distance = new_params.max_distance;
        pBVar1->distance_postfix_bits = new_params.distance_postfix_bits;
        pBVar1->num_direct_distance_codes = new_params.num_direct_distance_codes;
        (params->dist).alphabet_size_max = new_params.alphabet_size_max;
        (params->dist).alphabet_size_limit = new_params.alphabet_size_limit;
        uVar22 = uVar22 + 1;
        local_c0 = dist_cost;
      } while (uVar22 != 0x10);
      uVar22 = 0x10;
      local_c0 = dist_cost;
    }
    uVar22 = uVar22 - 1 >> 1;
LAB_003249c1:
    m_00 = local_70;
    uVar21 = uVar21 + 1;
  } while (uVar21 != 4);
  if ((bVar25) &&
     (ComputeDistanceCost(cmds,num_commands,&orig_params,&orig_params,&dist_cost,pHVar7),
     dist_cost < local_c0)) {
    (params->dist).max_distance = orig_params.max_distance;
    pBVar1->distance_postfix_bits = orig_params.distance_postfix_bits;
    pBVar1->num_direct_distance_codes = orig_params.num_direct_distance_codes;
    (params->dist).alphabet_size_max = orig_params.alphabet_size_max;
    (params->dist).alphabet_size_limit = orig_params.alphabet_size_limit;
  }
  BrotliFree(m_00,pHVar7);
  if (uVar3 == pBVar1->distance_postfix_bits) {
    if ((num_commands != 0) && ((uint32_t)local_e0 != (params->dist).num_direct_distance_codes)) {
LAB_00324a7a:
      bVar11 = (byte)uVar5;
      puVar16 = &cmds->dist_prefix_;
      sVar19 = num_commands;
      do {
        if (((*(uint *)(puVar16 + -5) & 0x1ffffff) != 0) && (0x7f < puVar16[-1])) {
          uVar22 = *puVar16 & 0x3ff;
          if ((uint32_t)local_e0 + 0x10 <= uVar22) {
            uVar22 = (uVar22 - (uint32_t)local_e0) - 0x10;
            uVar22 = (uVar22 & ~(-1 << (bVar11 & 0x1f))) + (uint32_t)local_e0 + 0x10 +
                     ((((uVar22 >> (uVar3 & 0x1f) & 1) != 0) + 2 << ((byte)(*puVar16 >> 10) & 0x1f))
                      + *(uint32_t *)(puVar16 + -3) + -4 << (bVar11 & 0x1f));
          }
          uVar15 = (ulong)uVar22;
          uVar18 = (ulong)(params->dist).num_direct_distance_codes;
          uVar13 = uVar18 + 0x10;
          if (uVar15 < uVar13) {
            uVar21 = 0;
          }
          else {
            bVar12 = (byte)pBVar1->distance_postfix_bits;
            uVar18 = ((4L << (bVar12 & 0x3f)) + (uVar15 - uVar18)) - 0x10;
            uVar22 = 0x1f;
            uVar17 = (uint)uVar18;
            if (uVar17 != 0) {
              for (; uVar17 >> uVar22 == 0; uVar22 = uVar22 - 1) {
              }
            }
            uVar22 = (uVar22 ^ 0xffffffe0) + 0x1f;
            bVar25 = (uVar18 >> ((ulong)uVar22 & 0x3f) & 1) != 0;
            iVar6 = uVar22 - pBVar1->distance_postfix_bits;
            uVar15 = (ulong)(((uint)bVar25 + iVar6 * 2 + 0xfffe << (bVar12 & 0x3f)) +
                             (int)uVar13 + (~(-1 << (bVar12 & 0x1f)) & uVar17) | iVar6 * 0x400);
            uVar21 = (uint32_t)
                     (uVar18 - ((ulong)bVar25 + 2 << ((byte)uVar22 & 0x3f)) >> (bVar12 & 0x3f));
          }
          *puVar16 = (ushort)uVar15;
          *(uint32_t *)(puVar16 + -3) = uVar21;
        }
        puVar16 = puVar16 + 8;
        sVar19 = sVar19 - 1;
      } while (sVar19 != 0);
    }
  }
  else if (num_commands != 0) goto LAB_00324a7a;
  dist_split = &mb->distance_split;
  BrotliSplitBlock(m_00,cmds,num_commands,ringbuffer,pos,mask,params,&mb->literal_split,
                   &mb->command_split,dist_split);
  sVar19 = (mb->literal_split).num_types;
  if (params->disable_literal_context_modeling == 0) {
    lVar23 = 0x40;
    if (sVar19 == 0) {
      sVar19 = 0;
      context_modes = (ContextType *)0x0;
    }
    else {
      context_modes = (ContextType *)BrotliAllocate(m_00,sVar19 << 2);
      auVar4 = _DAT_003b4390;
      sVar19 = (mb->literal_split).num_types;
      if (sVar19 == 0) {
        sVar19 = 0;
      }
      else {
        lVar28 = sVar19 - 1;
        auVar26._8_4_ = (int)lVar28;
        auVar26._0_8_ = lVar28;
        auVar26._12_4_ = (int)((ulong)lVar28 >> 0x20);
        uVar13 = 0;
        auVar26 = auVar26 ^ _DAT_003b4390;
        auVar27 = _DAT_003b4370;
        auVar29 = _DAT_003b4380;
        do {
          auVar30 = auVar29 ^ auVar4;
          iVar6 = auVar26._4_4_;
          if ((bool)(~(auVar30._4_4_ == iVar6 && auVar26._0_4_ < auVar30._0_4_ ||
                      iVar6 < auVar30._4_4_) & 1)) {
            context_modes[uVar13] = literal_context_mode;
          }
          if ((auVar30._12_4_ != auVar26._12_4_ || auVar30._8_4_ <= auVar26._8_4_) &&
              auVar30._12_4_ <= auVar26._12_4_) {
            context_modes[uVar13 + 1] = literal_context_mode;
          }
          auVar30 = auVar27 ^ auVar4;
          iVar31 = auVar30._4_4_;
          if (iVar31 <= iVar6 && (iVar31 != iVar6 || auVar30._0_4_ <= auVar26._0_4_)) {
            context_modes[uVar13 + 2] = literal_context_mode;
            context_modes[uVar13 + 3] = literal_context_mode;
          }
          uVar13 = uVar13 + 4;
          lVar28 = auVar29._8_8_;
          auVar29._0_8_ = auVar29._0_8_ + 4;
          auVar29._8_8_ = lVar28 + 4;
          lVar28 = auVar27._8_8_;
          auVar27._0_8_ = auVar27._0_8_ + 4;
          auVar27._8_8_ = lVar28 + 4;
        } while ((sVar19 + 3 & 0xfffffffffffffffc) != uVar13);
      }
    }
  }
  else {
    context_modes = (ContextType *)0x0;
    lVar23 = 1;
  }
  sVar19 = sVar19 * lVar23;
  if (sVar19 == 0) {
    local_d8 = (HistogramLiteral *)0x0;
  }
  else {
    local_d8 = (HistogramLiteral *)BrotliAllocate(m_00,sVar19 * 0x410);
    sVar20 = sVar19;
    pHVar10 = local_d8;
    do {
      memset(pHVar10,0,0x408);
      pHVar10->bit_cost_ = INFINITY;
      pHVar10 = pHVar10 + 1;
      sVar20 = sVar20 - 1;
    } while (sVar20 != 0);
  }
  lVar23 = dist_split->num_types * 4;
  if (lVar23 == 0) {
    local_e0 = (HistogramDistance *)0x0;
  }
  else {
    local_e0 = (HistogramDistance *)BrotliAllocate(m_00,dist_split->num_types * 0x2240);
    pHVar7 = local_e0;
    do {
      memset(pHVar7,0,0x888);
      pHVar7->bit_cost_ = INFINITY;
      pHVar7 = pHVar7 + 1;
      lVar23 = lVar23 + -1;
    } while (lVar23 != 0);
  }
  sVar20 = (mb->command_split).num_types;
  mb->command_histograms_size = sVar20;
  if (sVar20 == 0) {
    mb->command_histograms = (HistogramCommand *)0x0;
    insert_and_copy_histograms = (HistogramCommand *)0x0;
  }
  else {
    insert_and_copy_histograms = (HistogramCommand *)BrotliAllocate(m_00,sVar20 * 0xb10);
    sVar20 = mb->command_histograms_size;
    mb->command_histograms = insert_and_copy_histograms;
    if (sVar20 != 0) {
      do {
        memset(insert_and_copy_histograms,0,0xb08);
        insert_and_copy_histograms->bit_cost_ = INFINITY;
        insert_and_copy_histograms = insert_and_copy_histograms + 1;
        sVar20 = sVar20 - 1;
      } while (sVar20 != 0);
      insert_and_copy_histograms = mb->command_histograms;
    }
  }
  BrotliBuildHistogramsWithContext
            (cmds,num_commands,&mb->literal_split,&mb->command_split,dist_split,ringbuffer,pos,mask,
             prev_byte,prev_byte2,context_modes,local_d8,insert_and_copy_histograms,local_e0);
  BrotliFree(m_00,context_modes);
  sVar20 = (mb->literal_split).num_types;
  sVar8 = sVar20 << 6;
  mb->literal_context_map_size = sVar8;
  if (sVar8 == 0) {
    puVar9 = (uint32_t *)0x0;
    mb->literal_context_map = (uint32_t *)0x0;
    mb->literal_histograms_size = 0;
LAB_00324f27:
    pHVar10 = (HistogramLiteral *)0x0;
  }
  else {
    puVar9 = (uint32_t *)BrotliAllocate(m_00,sVar20 << 8);
    sVar20 = mb->literal_context_map_size;
    mb->literal_context_map = puVar9;
    mb->literal_histograms_size = sVar20;
    if (sVar20 == 0) goto LAB_00324f27;
    pHVar10 = (HistogramLiteral *)BrotliAllocate(m_00,sVar20 * 0x410);
    puVar9 = mb->literal_context_map;
  }
  mb->literal_histograms = pHVar10;
  BrotliClusterHistogramsLiteral
            (m_00,local_d8,sVar19,0x100,pHVar10,&mb->literal_histograms_size,puVar9);
  BrotliFree(m_00,local_d8);
  if ((params->disable_literal_context_modeling != 0) &&
     (sVar19 = (mb->literal_split).num_types, sVar19 != 0)) {
    puVar9 = mb->literal_context_map;
    puVar14 = puVar9 + sVar19 * 0x40;
    do {
      uVar3 = puVar9[sVar19 - 1];
      sVar19 = sVar19 - 1;
      lVar23 = -0x40;
      do {
        puVar2 = puVar14 + lVar23;
        *puVar2 = uVar3;
        puVar2[1] = uVar3;
        puVar2[2] = uVar3;
        puVar2[3] = uVar3;
        lVar23 = lVar23 + 4;
      } while (lVar23 != 0);
      puVar14 = puVar14 + -0x40;
    } while (sVar19 != 0);
  }
  sVar20 = (mb->distance_split).num_types;
  sVar19 = sVar20 * 4;
  mb->distance_context_map_size = sVar19;
  if (sVar19 == 0) {
    puVar9 = (uint32_t *)0x0;
    mb->distance_context_map = (uint32_t *)0x0;
    mb->distance_histograms_size = 0;
  }
  else {
    puVar9 = (uint32_t *)BrotliAllocate(m_00,sVar20 << 4);
    sVar19 = mb->distance_context_map_size;
    mb->distance_context_map = puVar9;
    mb->distance_histograms_size = sVar19;
    if (sVar19 != 0) {
      pHVar7 = (HistogramDistance *)BrotliAllocate(m_00,sVar19 * 0x890);
      puVar9 = mb->distance_context_map;
      sVar19 = mb->distance_context_map_size;
      goto LAB_0032502c;
    }
  }
  sVar19 = 0;
  pHVar7 = (HistogramDistance *)0x0;
LAB_0032502c:
  mb->distance_histograms = pHVar7;
  BrotliClusterHistogramsDistance
            (m_00,local_e0,sVar19,0x100,pHVar7,&mb->distance_histograms_size,puVar9);
  BrotliFree(m_00,local_e0);
  return;
}

Assistant:

void duckdb_brotli::BrotliBuildMetaBlock(MemoryManager* m,
                          const uint8_t* ringbuffer,
                          const size_t pos,
                          const size_t mask,
                          BrotliEncoderParams* params,
                          uint8_t prev_byte,
                          uint8_t prev_byte2,
                          Command* cmds,
                          size_t num_commands,
                          ContextType literal_context_mode,
                          MetaBlockSplit* mb) {
  /* Histogram ids need to fit in one byte. */
  static const size_t kMaxNumberOfHistograms = 256;
  HistogramDistance* distance_histograms;
  HistogramLiteral* literal_histograms;
  ContextType* literal_context_modes = NULL;
  size_t literal_histograms_size;
  size_t distance_histograms_size;
  size_t i;
  size_t literal_context_multiplier = 1;
  uint32_t npostfix;
  uint32_t ndirect_msb = 0;
  BROTLI_BOOL check_orig = BROTLI_TRUE;
  double best_dist_cost = 1e99;
  BrotliDistanceParams orig_params = params->dist;
  BrotliDistanceParams new_params = params->dist;
  HistogramDistance* tmp = BROTLI_ALLOC(m, HistogramDistance, 1);

  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(tmp)) return;

  for (npostfix = 0; npostfix <= BROTLI_MAX_NPOSTFIX; npostfix++) {
    for (; ndirect_msb < 16; ndirect_msb++) {
      uint32_t ndirect = ndirect_msb << npostfix;
      BROTLI_BOOL skip;
      double dist_cost;
      BrotliInitDistanceParams(&new_params, npostfix, ndirect,
                               params->large_window);
      if (npostfix == orig_params.distance_postfix_bits &&
          ndirect == orig_params.num_direct_distance_codes) {
        check_orig = BROTLI_FALSE;
      }
      skip = !ComputeDistanceCost(
          cmds, num_commands, &orig_params, &new_params, &dist_cost, tmp);
      if (skip || (dist_cost > best_dist_cost)) {
        break;
      }
      best_dist_cost = dist_cost;
      params->dist = new_params;
    }
    if (ndirect_msb > 0) ndirect_msb--;
    ndirect_msb /= 2;
  }
  if (check_orig) {
    double dist_cost;
    ComputeDistanceCost(cmds, num_commands, &orig_params, &orig_params,
                        &dist_cost, tmp);
    if (dist_cost < best_dist_cost) {
      /* NB: currently unused; uncomment when more param tuning is added. */
      /* best_dist_cost = dist_cost; */
      params->dist = orig_params;
    }
  }
  BROTLI_FREE(m, tmp);
  RecomputeDistancePrefixes(cmds, num_commands, &orig_params, &params->dist);

  BrotliSplitBlock(m, cmds, num_commands,
                   ringbuffer, pos, mask, params,
                   &mb->literal_split,
                   &mb->command_split,
                   &mb->distance_split);
  if (BROTLI_IS_OOM(m)) return;

  if (!params->disable_literal_context_modeling) {
    literal_context_multiplier = 1 << BROTLI_LITERAL_CONTEXT_BITS;
    literal_context_modes =
        BROTLI_ALLOC(m, ContextType, mb->literal_split.num_types);
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(literal_context_modes)) return;
    for (i = 0; i < mb->literal_split.num_types; ++i) {
      literal_context_modes[i] = literal_context_mode;
    }
  }

  literal_histograms_size =
      mb->literal_split.num_types * literal_context_multiplier;
  literal_histograms =
      BROTLI_ALLOC(m, HistogramLiteral, literal_histograms_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(literal_histograms)) return;
  ClearHistogramsLiteral(literal_histograms, literal_histograms_size);

  distance_histograms_size =
      mb->distance_split.num_types << BROTLI_DISTANCE_CONTEXT_BITS;
  distance_histograms =
      BROTLI_ALLOC(m, HistogramDistance, distance_histograms_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(distance_histograms)) return;
  ClearHistogramsDistance(distance_histograms, distance_histograms_size);

  BROTLI_DCHECK(mb->command_histograms == 0);
  mb->command_histograms_size = mb->command_split.num_types;
  mb->command_histograms =
      BROTLI_ALLOC(m, HistogramCommand, mb->command_histograms_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(mb->command_histograms)) return;
  ClearHistogramsCommand(mb->command_histograms, mb->command_histograms_size);

  BrotliBuildHistogramsWithContext(cmds, num_commands,
      &mb->literal_split, &mb->command_split, &mb->distance_split,
      ringbuffer, pos, mask, prev_byte, prev_byte2, literal_context_modes,
      literal_histograms, mb->command_histograms, distance_histograms);
  BROTLI_FREE(m, literal_context_modes);

  BROTLI_DCHECK(mb->literal_context_map == 0);
  mb->literal_context_map_size =
      mb->literal_split.num_types << BROTLI_LITERAL_CONTEXT_BITS;
  mb->literal_context_map =
      BROTLI_ALLOC(m, uint32_t, mb->literal_context_map_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(mb->literal_context_map)) return;

  BROTLI_DCHECK(mb->literal_histograms == 0);
  mb->literal_histograms_size = mb->literal_context_map_size;
  mb->literal_histograms =
      BROTLI_ALLOC(m, HistogramLiteral, mb->literal_histograms_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(mb->literal_histograms)) return;

  BrotliClusterHistogramsLiteral(m, literal_histograms, literal_histograms_size,
      kMaxNumberOfHistograms, mb->literal_histograms,
      &mb->literal_histograms_size, mb->literal_context_map);
  if (BROTLI_IS_OOM(m)) return;
  BROTLI_FREE(m, literal_histograms);

  if (params->disable_literal_context_modeling) {
    /* Distribute assignment to all contexts. */
    for (i = mb->literal_split.num_types; i != 0;) {
      size_t j = 0;
      i--;
      for (; j < (1 << BROTLI_LITERAL_CONTEXT_BITS); j++) {
        mb->literal_context_map[(i << BROTLI_LITERAL_CONTEXT_BITS) + j] =
            mb->literal_context_map[i];
      }
    }
  }

  BROTLI_DCHECK(mb->distance_context_map == 0);
  mb->distance_context_map_size =
      mb->distance_split.num_types << BROTLI_DISTANCE_CONTEXT_BITS;
  mb->distance_context_map =
      BROTLI_ALLOC(m, uint32_t, mb->distance_context_map_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(mb->distance_context_map)) return;

  BROTLI_DCHECK(mb->distance_histograms == 0);
  mb->distance_histograms_size = mb->distance_context_map_size;
  mb->distance_histograms =
      BROTLI_ALLOC(m, HistogramDistance, mb->distance_histograms_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(mb->distance_histograms)) return;

  BrotliClusterHistogramsDistance(m, distance_histograms,
                                  mb->distance_context_map_size,
                                  kMaxNumberOfHistograms,
                                  mb->distance_histograms,
                                  &mb->distance_histograms_size,
                                  mb->distance_context_map);
  if (BROTLI_IS_OOM(m)) return;
  BROTLI_FREE(m, distance_histograms);
}